

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

void __thiscall
duckdb::BaseNumericStatsUnifier<duckdb::timestamp_ms_t>::UnifyMinMax
          (BaseNumericStatsUnifier<duckdb::timestamp_ms_t> *this,string *new_min,string *new_max)

{
  bool bVar1;
  long lVar2;
  InternalException *this_00;
  char *pcVar3;
  const_data_ptr_t pdVar4;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  timestamp_ms_t global_max_val;
  timestamp_ms_t max_val;
  timestamp_ms_t global_min_val;
  timestamp_ms_t min_val;
  timestamp_ms_t *in_stack_ffffffffffffff78;
  timestamp_ms_t *in_stack_ffffffffffffff80;
  allocator *paVar5;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 8) && (lVar2 = std::__cxx11::string::size(), lVar2 == 8)) {
    if ((*(byte *)(in_RDI + 0x72) & 1) == 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_10);
      *(undefined1 *)(in_RDI + 0x72) = 1;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::data();
      pdVar4 = const_data_ptr_cast<char>(pcVar3);
      Load<duckdb::timestamp_ms_t>(pdVar4);
      pcVar3 = (char *)std::__cxx11::string::data();
      pdVar4 = const_data_ptr_cast<char>(pcVar3);
      Load<duckdb::timestamp_ms_t>(pdVar4);
      bVar1 = LessThan::Operation<duckdb::timestamp_ms_t>
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_10);
      }
    }
    if ((*(byte *)(in_RDI + 0x73) & 1) == 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x48),local_18);
      *(undefined1 *)(in_RDI + 0x73) = 1;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::data();
      pdVar4 = const_data_ptr_cast<char>(pcVar3);
      Load<duckdb::timestamp_ms_t>(pdVar4);
      pcVar3 = (char *)std::__cxx11::string::data();
      pdVar4 = const_data_ptr_cast<char>(pcVar3);
      Load<duckdb::timestamp_ms_t>(pdVar4);
      bVar1 = GreaterThan::Operation<duckdb::timestamp_ms_t>
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(in_RDI + 0x48),local_18);
      }
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  paVar5 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Incorrect size for stats in UnifyMinMax",paVar5);
  duckdb::InternalException::InternalException(this_00,local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void UnifyMinMax(const string &new_min, const string &new_max) override {
		if (new_min.size() != sizeof(T) || new_max.size() != sizeof(T)) {
			throw InternalException("Incorrect size for stats in UnifyMinMax");
		}
		if (!min_is_set) {
			global_min = new_min;
			min_is_set = true;
		} else {
			auto min_val = Load<T>(const_data_ptr_cast(new_min.data()));
			auto global_min_val = Load<T>(const_data_ptr_cast(global_min.data()));
			if (LessThan::Operation(min_val, global_min_val)) {
				global_min = new_min;
			}
		}
		if (!max_is_set) {
			global_max = new_max;
			max_is_set = true;
		} else {
			auto max_val = Load<T>(const_data_ptr_cast(new_max.data()));
			auto global_max_val = Load<T>(const_data_ptr_cast(global_max.data()));
			if (GreaterThan::Operation(max_val, global_max_val)) {
				global_max = new_max;
			}
		}
	}